

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char cVar2;
  float *pfVar3;
  char *pcVar4;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int i_3;
  float scale_2;
  char *outptr_1;
  float *ptr_1;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j;
  float scale_1;
  char *outptr0;
  float *ptr0;
  int i_2;
  int h;
  int w_1;
  int i_1;
  int i;
  float scale;
  char *outptr;
  float *ptr;
  int w;
  int dims;
  Mat *in_stack_fffffffffffffe90;
  Mat *pMVar5;
  Allocator *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  int local_140;
  Mat local_138;
  char *local_f0;
  Mat local_d8;
  float *local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  float local_6c;
  char *local_68;
  float *local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  float local_44;
  char *local_40;
  float *local_38;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  
  local_2c = in_RSI->dims;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_2c == 1) {
    local_30 = in_RSI->w;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0,
                      in_stack_fffffffffffffe98);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffe90);
    if (bVar1) {
      return -100;
    }
    local_38 = ncnn::Mat::operator_cast_to_float_(local_18);
    local_40 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
    if ((int)in_RDI[2].cstep == 1) {
      pfVar3 = ncnn::Mat::operator[](in_RDI + 3,0);
      local_44 = *pfVar3;
      for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
        cVar2 = float2int8(SUB84(in_stack_fffffffffffffe90,0));
        local_40[local_48] = cVar2;
      }
    }
    else {
      for (local_4c = 0; local_4c < local_30; local_4c = local_4c + 1) {
        in_stack_fffffffffffffeb4 = local_38[local_4c];
        ncnn::Mat::operator[](in_RDI + 3,(long)local_4c);
        cVar2 = float2int8(SUB84(in_stack_fffffffffffffe90,0));
        local_40[local_4c] = cVar2;
      }
    }
  }
  if (local_2c == 2) {
    local_50 = local_18->w;
    local_54 = local_18->h;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8
                      ,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffe90);
    if (bVar1) {
      return -100;
    }
    for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
      local_60 = ncnn::Mat::row(local_18,local_58);
      local_68 = ncnn::Mat::row<signed_char>(local_20,local_58);
      if ((int)in_RDI[2].cstep == 1) {
        pfVar3 = ncnn::Mat::operator[](in_RDI + 3,0);
        in_stack_fffffffffffffeb0 = *pfVar3;
      }
      else {
        pfVar3 = ncnn::Mat::operator[](in_RDI + 3,(long)local_58);
        in_stack_fffffffffffffeb0 = *pfVar3;
      }
      local_6c = in_stack_fffffffffffffeb0;
      for (local_70 = 0; local_70 < local_50; local_70 = local_70 + 1) {
        cVar2 = float2int8(SUB84(in_stack_fffffffffffffe90,0));
        local_68[local_70] = cVar2;
      }
    }
  }
  if (local_2c == 3) {
    local_74 = local_18->w;
    local_78 = local_18->h;
    local_7c = local_18->c;
    local_80 = local_74 * local_78;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8
                      ,(int)(in_stack_fffffffffffffea0 >> 0x20),(size_t)in_stack_fffffffffffffe98,
                      (Allocator *)in_stack_fffffffffffffe90);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffe90);
    if (bVar1) {
      return -100;
    }
    for (local_84 = 0; local_84 < local_7c; local_84 = local_84 + 1) {
      pMVar5 = &local_d8;
      ncnn::Mat::channel(in_RDI,(int)in_stack_fffffffffffffeb4);
      pfVar3 = ncnn::Mat::operator_cast_to_float_(pMVar5);
      ncnn::Mat::~Mat((Mat *)0x6ba68f);
      pMVar5 = &local_138;
      local_90 = pfVar3;
      ncnn::Mat::channel(in_RDI,(int)in_stack_fffffffffffffeb4);
      pcVar4 = ncnn::Mat::operator_cast_to_signed_char_(pMVar5);
      ncnn::Mat::~Mat((Mat *)0x6ba6d5);
      local_f0 = pcVar4;
      if ((int)in_RDI[2].cstep == 1) {
        ncnn::Mat::operator[](in_RDI + 3,0);
      }
      else {
        ncnn::Mat::operator[](in_RDI + 3,(long)local_84);
      }
      for (local_140 = 0; local_140 < local_80; local_140 = local_140 + 1) {
        cVar2 = float2int8(SUB84(pMVar5,0));
        local_f0[local_140] = cVar2;
      }
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale_data[i]);
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr0 = bottom_blob.row(i);
            signed char* outptr0 = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            for (int j = 0; j < w; j++)
            {
                outptr0[j] = float2int8(ptr0[j] * scale);
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}